

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2_jit_compile.c
# Opt level: O1

void compile_backtrackingpath(compiler_common *common,backtrack_common *current)

{
  ushort uVar1;
  int iVar2;
  compiler_common *common_00;
  backtrack_common *pbVar3;
  PCRE2_SPTR16 cc;
  backtrack_common *pbVar4;
  jump_list *pjVar5;
  backtrack_common *pbVar6;
  sljit_jump *psVar7;
  sljit_u8 *psVar8;
  sljit_jump *psVar9;
  sljit_label *psVar10;
  uint uVar11;
  sljit_s32 a;
  int src;
  sljit_compiler *psVar12;
  sljit_u32 *in_R8;
  long srcw;
  int iVar13;
  PCRE2_SPTR16 *in_stack_fffffffffffffef8;
  PCRE2_UCHAR16 type;
  sljit_compiler *local_f8;
  compiler_common *local_f0;
  PCRE2_UCHAR16 opcode;
  then_trap_backtrack **local_e0;
  sljit_u32 max;
  jump_list **local_d0;
  jump_list *jumplist;
  jump_list *pjStack_c0;
  backtrack_common *local_b8;
  jump_list *pjStack_b0;
  compiler_common *local_a8;
  jump_list *pjStack_a0;
  undefined8 local_98;
  backtrack_common *pbStack_90;
  jump_list **local_88;
  jump_list **local_80;
  jump_list **local_78;
  sljit_s32 *local_70;
  sljit_s32 *local_68;
  sljit_s32 *local_60;
  sljit_label **local_58;
  then_trap_backtrack *local_50;
  long local_48;
  sljit_u32 exact;
  sljit_u32 local_38 [2];
  
  local_50 = common->then_trap;
  local_e0 = &common->then_trap;
  if (current != (backtrack_common *)0x0) {
    local_f8 = common->compiler;
    local_80 = &common->revertframes;
    local_d0 = &common->quit;
    local_70 = &common->control_head_ptr;
    local_88 = &common->positive_assertion_quit;
    local_58 = &common->quit_label;
    local_78 = &common->reset_match;
    local_60 = &common->ovector_start;
    local_68 = &common->capture_last_ptr;
    local_f0 = common;
    do {
      if (current->nextbacktracks != (jump_list *)0x0) {
        compile_backtrackingpath_cold_1();
      }
      psVar12 = local_f8;
      common_00 = (compiler_common *)current->cc;
      uVar1 = *(ushort *)&common_00->compiler;
      uVar11 = (uint)uVar1;
      switch(uVar1) {
      case 3:
        if (local_f8->error == 0) {
          local_f8->mode32 = 0;
          psVar8 = emit_x86_instruction(local_f8,1,1,0,0x8c,0);
          if (psVar8 != (sljit_u8 *)0x0) {
            *psVar8 = 0x8b;
          }
        }
        in_R8 = (sljit_u32 *)0xc;
        sljit_emit_op2(common->compiler,0x60,0xc,0,0xc,0,0x40,8);
        if (psVar12->error == 0) {
          iVar2 = common->ovector_start;
          local_f8->mode32 = 0;
          psVar12 = local_f8;
LAB_00153f3c:
          a = 1;
LAB_00153f46:
          in_R8 = (sljit_u32 *)0x8e;
          psVar8 = emit_x86_instruction(psVar12,1,a,0,0x8e,(long)iVar2);
          if (psVar8 != (sljit_u8 *)0x0) {
            *psVar8 = 0x89;
          }
        }
        break;
      case 0x21:
      case 0x22:
      case 0x23:
      case 0x24:
      case 0x25:
      case 0x26:
      case 0x27:
      case 0x28:
      case 0x29:
      case 0x2a:
      case 0x2b:
      case 0x2c:
      case 0x2d:
      case 0x2e:
      case 0x2f:
      case 0x30:
      case 0x31:
      case 0x32:
      case 0x33:
      case 0x34:
      case 0x35:
      case 0x36:
      case 0x37:
      case 0x38:
      case 0x39:
      case 0x3a:
      case 0x3b:
      case 0x3c:
      case 0x3d:
      case 0x3e:
      case 0x3f:
      case 0x40:
      case 0x41:
      case 0x42:
      case 0x43:
      case 0x44:
      case 0x45:
      case 0x46:
      case 0x47:
      case 0x48:
      case 0x49:
      case 0x4a:
      case 0x4b:
      case 0x4c:
      case 0x4d:
      case 0x4e:
      case 0x4f:
      case 0x50:
      case 0x51:
      case 0x52:
      case 0x53:
      case 0x54:
      case 0x55:
      case 0x56:
      case 0x57:
      case 0x58:
      case 0x59:
      case 0x5a:
      case 0x5b:
      case 0x5c:
      case 0x5d:
      case 0x5e:
      case 0x5f:
      case 0x60:
      case 0x61:
      case 0x6e:
      case 0x6f:
      case 0x70:
        psVar12 = common->compiler;
        max = 0;
        jumplist = (jump_list *)0x0;
        iVar2 = *(int *)((long)common->private_data_ptrs +
                        ((long)common_00 - (long)common->start) * 2);
        srcw = (long)iVar2;
        in_R8 = &exact;
        cc = get_iterator_parameters
                       (common_00,&opcode,&type,(PCRE2_UCHAR16 *)&max,in_R8,local_38,
                        in_stack_fffffffffffffef8);
        if (opcode - 0x21 < 8) {
          src = (uint)(srcw != 0) * 2 + 0x8c;
          iVar13 = (int)(srcw + 8);
          switch((uint)opcode) {
          default:
            if ((type == 0x16) || (type == 0x11)) {
              compile_backtrackingpath_cold_28();
            }
            else {
              if (*(int *)&current[1].top == 0) {
                sljit_emit_op1(psVar12,0x20,2,0,src,srcw);
                psVar9 = sljit_emit_cmp(psVar12,5,2,0,src,(long)iVar13);
                sljit_emit_op2(local_f0->compiler,0x62,2,0,2,0,0x40,2);
                in_R8 = (sljit_u32 *)&DAT_00000002;
                sljit_emit_op1(psVar12,0x20,src,srcw,2,0);
                pbVar4 = (backtrack_common *)sljit_emit_jump(psVar12,0x18);
                if (pbVar4 != (backtrack_common *)0x0) {
                  pbVar6 = current[1].prev;
                  pbVar3 = pbVar6;
joined_r0x00153943:
                  if (pbVar3 != (backtrack_common *)0x0) {
                    pbVar4->top = (backtrack_common *)
                                  (((ulong)pbVar4->top & 0xfffffffffffffffc) + 1);
                    ((anon_union_8_2_cb96b71c_for_u *)&pbVar4->topbacktracks)->target =
                         (sljit_uw)pbVar6;
                  }
                }
              }
              else {
                sljit_emit_op1(psVar12,0x20,2,0,src,srcw);
                sljit_emit_op1(psVar12,0x20,4,0,src,srcw + 8);
                sljit_emit_op2(psVar12,0x62,2,0,2,0,0x40,2);
                psVar9 = sljit_emit_cmp(psVar12,5,2,0,4,0);
                pbVar6 = (backtrack_common *)sljit_emit_label(psVar12);
                if (psVar12->error == 0) {
                  psVar12->mode32 = 0;
                  psVar8 = emit_x86_instruction(psVar12,2,1,0,0x82,-2);
                  if (psVar8 != (sljit_u8 *)0x0) {
                    psVar8[0] = '\x0f';
                    psVar8[1] = 0xb7;
                  }
                }
                sljit_emit_op1(psVar12,0x20,src,srcw,2,0);
                uVar11 = *(uint *)&current[1].nextbacktracks;
                if (((ulong)uVar11 != 0) && (psVar12->error == 0)) {
                  psVar12->mode32 = 0;
                  emit_cum_binary(psVar12,0xd0b0908,1,0,1,0,0x40,(ulong)uVar11);
                }
                psVar7 = sljit_emit_cmp(psVar12,0,1,0,0x40,
                                        (ulong)*(ushort *)((long)&current[1].nextbacktracks + 4));
                if ((psVar7 != (sljit_jump *)0x0) &&
                   (pbVar4 = current[1].prev, pbVar4 != (backtrack_common *)0x0)) {
                  psVar7->flags = (psVar7->flags & 0xfffffffffffffffcU) + 1;
                  (psVar7->u).target = (sljit_uw)pbVar4;
                }
                sljit_emit_op2(local_f0->compiler,0x62,2,0,2,0,0x40,2);
                in_R8 = (sljit_u32 *)0x4;
                pbVar4 = (backtrack_common *)sljit_emit_cmp(psVar12,4,2,0,4,0);
                pbVar3 = pbVar4;
                if (pbVar6 != (backtrack_common *)0x0) goto joined_r0x00153943;
              }
              psVar10 = sljit_emit_label(psVar12);
              if ((psVar9 != (sljit_jump *)0x0) && (psVar10 != (sljit_label *)0x0)) {
                psVar9->flags = (psVar9->flags & 0xfffffffffffffffcU) + 1;
                (psVar9->u).label = psVar10;
              }
              if (iVar2 == 0) {
                compile_backtrackingpath_cold_29();
              }
            }
            break;
          case 0x22:
            sljit_emit_op1(psVar12,0x20,2,0,src,srcw);
            compile_char1_matchingpath(local_f0,type,cc,&jumplist,1);
            in_R8 = (sljit_u32 *)&DAT_00000002;
            sljit_emit_op1(psVar12,0x20,src,srcw,2,0);
            psVar9 = sljit_emit_jump(psVar12,0x18);
            pjVar5 = jumplist;
            if ((psVar9 != (sljit_jump *)0x0) &&
               (pbVar6 = current[1].prev, pbVar6 != (backtrack_common *)0x0)) {
              psVar9->flags = (psVar9->flags & 0xfffffffffffffffcU) + 1;
              (psVar9->u).target = (sljit_uw)pbVar6;
            }
            sljit_emit_label(psVar12);
            if (pjVar5 != (jump_list *)0x0) {
              compile_backtrackingpath_cold_26();
            }
            if (iVar2 == 0) {
              compile_backtrackingpath_cold_27();
            }
            break;
          case 0x23:
          case 0x24:
            break;
          case 0x25:
            sljit_emit_op1(psVar12,0x20,2,0,src,srcw);
            sljit_emit_op1(psVar12,0x20,src,srcw,0x40,0);
            psVar9 = sljit_emit_cmp(psVar12,1,2,0,0x40,0);
            if ((psVar9 != (sljit_jump *)0x0) &&
               (pbVar6 = current[1].prev, pbVar6 != (backtrack_common *)0x0)) {
              psVar9->flags = (psVar9->flags & 0xfffffffffffffffcU) + 1;
              (psVar9->u).target = (sljit_uw)pbVar6;
            }
            psVar9 = sljit_emit_jump(psVar12,0x18);
            pjVar5 = current[1].nextbacktracks;
            sljit_emit_label(psVar12);
            if (pjVar5 != (jump_list *)0x0) {
              compile_backtrackingpath_cold_22();
            }
            sljit_emit_op1(psVar12,0x20,2,0,src,srcw);
            in_R8 = (sljit_u32 *)0x40;
            sljit_emit_op1(psVar12,0x20,src,srcw,0x40,0);
            psVar7 = sljit_emit_jump(psVar12,0x18);
            if ((psVar7 != (sljit_jump *)0x0) &&
               (pbVar6 = current[1].prev, pbVar6 != (backtrack_common *)0x0)) {
              psVar7->flags = (psVar7->flags & 0xfffffffffffffffcU) + 1;
              (psVar7->u).target = (sljit_uw)pbVar6;
            }
            psVar10 = sljit_emit_label(psVar12);
            if ((psVar9 != (sljit_jump *)0x0) && (psVar10 != (sljit_label *)0x0)) {
              psVar9->flags = (psVar9->flags & 0xfffffffffffffffcU) + 1;
              (psVar9->u).label = psVar10;
            }
            if (iVar2 == 0) {
              compile_backtrackingpath_cold_23();
            }
            break;
          case 0x26:
            sljit_emit_op1(psVar12,0x20,2,0,src,srcw);
            sljit_emit_op1(psVar12,0x20,src,srcw,0x40,0);
            psVar9 = sljit_emit_cmp(psVar12,0,2,0,0x40,0);
            in_R8 = (sljit_u32 *)0x1;
            compile_char1_matchingpath(local_f0,type,cc,&jumplist,1);
            psVar7 = sljit_emit_jump(psVar12,0x18);
            pjVar5 = jumplist;
            if ((psVar7 != (sljit_jump *)0x0) &&
               (pbVar6 = current[1].prev, pbVar6 != (backtrack_common *)0x0)) {
              psVar7->flags = (psVar7->flags & 0xfffffffffffffffcU) + 1;
              (psVar7->u).target = (sljit_uw)pbVar6;
            }
            sljit_emit_label(psVar12);
            if (pjVar5 != (jump_list *)0x0) {
              compile_backtrackingpath_cold_20();
            }
            psVar10 = sljit_emit_label(psVar12);
            if ((psVar9 != (sljit_jump *)0x0) && (psVar10 != (sljit_label *)0x0)) {
              psVar9->flags = (psVar9->flags & 0xfffffffffffffffcU) + 1;
              (psVar9->u).label = psVar10;
            }
            if (iVar2 == 0) {
              compile_backtrackingpath_cold_21();
            }
            break;
          case 0x28:
            local_48 = (long)iVar13;
            sljit_emit_op1(psVar12,0x20,1,0,src,local_48);
            sljit_emit_op1(psVar12,0x20,2,0,src,srcw);
            if (psVar12->error == 0) {
              psVar12->mode32 = 0;
              psVar8 = emit_x86_instruction(psVar12,0x11,0x40,1,1,0);
              if (psVar8 != (sljit_u8 *)0x0) {
                psVar8[1] = psVar8[1] | 0x28;
              }
            }
            psVar9 = sljit_emit_jump(psVar12,0);
            if (psVar12->error == 0) {
              pjVar5 = (jump_list *)ensure_abuf(psVar12,0x10);
            }
            else {
              pjVar5 = (jump_list *)0x0;
            }
            if (pjVar5 != (jump_list *)0x0) {
              pjVar5->next = jumplist;
              pjVar5->jump = psVar9;
              jumplist = pjVar5;
            }
            sljit_emit_op1(psVar12,0x20,src,local_48,1,0);
            compile_char1_matchingpath(local_f0,type,cc,&jumplist,1);
            in_R8 = (sljit_u32 *)&DAT_00000002;
            sljit_emit_op1(psVar12,0x20,src,srcw,2,0);
            psVar9 = sljit_emit_jump(psVar12,0x18);
            pjVar5 = jumplist;
            if ((psVar9 != (sljit_jump *)0x0) &&
               (pbVar6 = current[1].prev, pbVar6 != (backtrack_common *)0x0)) {
              psVar9->flags = (psVar9->flags & 0xfffffffffffffffcU) + 1;
              (psVar9->u).target = (sljit_uw)pbVar6;
            }
            sljit_emit_label(psVar12);
            if (pjVar5 != (jump_list *)0x0) {
              compile_backtrackingpath_cold_24();
            }
            if (iVar2 == 0) {
              compile_backtrackingpath_cold_25();
            }
          }
        }
        pjVar5 = current->topbacktracks;
        sljit_emit_label(psVar12);
        common = local_f0;
        if (pjVar5 != (jump_list *)0x0) {
          compile_backtrackingpath_cold_30();
          common = local_f0;
        }
        break;
      case 0x71:
      case 0x72:
      case 0x73:
      case 0x74:
        if ((*(byte *)((long)&common_00->compiler + (ulong)(3 - ((ushort)(uVar1 - 0x71) < 2)) * 2) &
            1) == 0) {
          compile_backtrackingpath_cold_19();
        }
        else {
          compile_backtrackingpath_cold_18();
        }
        break;
      case 0x75:
        psVar12 = common->compiler;
        if (*(int *)&current[1].top == 0) {
          if (current[1].nextbacktracks[1].jump == (sljit_jump *)0x0) {
            compile_backtrackingpath_cold_16();
          }
          else {
            compile_backtrackingpath_cold_15();
          }
          in_R8 = (sljit_u32 *)0x40;
          psVar9 = sljit_emit_cmp(psVar12,1,1,0,0x40,0);
          if ((psVar9 != (sljit_jump *)0x0) &&
             (pbVar6 = current[1].prev, pbVar6 != (backtrack_common *)0x0)) {
            psVar9->flags = (psVar9->flags & 0xfffffffffffffffcU) + 1;
            (psVar9->u).target = (sljit_uw)pbVar6;
          }
        }
        else {
          compile_backtrackingpath(common,current->top);
        }
        pjVar5 = current->topbacktracks;
        sljit_emit_label(psVar12);
        if (pjVar5 != (jump_list *)0x0) {
          compile_backtrackingpath_cold_17();
        }
        break;
      case 0x76:
      case 0x77:
      case 0x9f:
      case 0xa0:
      case 0xa1:
        compile_backtrackingpath_cold_4();
        break;
      case 0x82:
      case 0x83:
      case 0x85:
      case 0x87:
      case 0x88:
      case 0x8a:
      case 0x8c:
switchD_00152f8a_caseD_82:
        pbVar6 = current;
LAB_00153c75:
        compile_bracket_backtrackingpath(common,pbVar6);
        break;
      case 0x84:
      case 0x86:
      case 0x89:
      case 0x8b:
      case 0x95:
        psVar12 = common->compiler;
        if (*(int *)((long)&current[1].prev + 4) < 0) {
          if ((uVar1 == 0x8b) || (uVar1 == 0x86)) {
            compile_backtrackingpath_cold_13();
          }
          pjVar5 = current->topbacktracks;
          sljit_emit_label(psVar12);
          if (pjVar5 != (jump_list *)0x0) {
            compile_backtrackingpath_cold_14();
          }
          in_R8 = (sljit_u32 *)0xc;
          sljit_emit_op2(common->compiler,0x60,0xc,0,0xc,0,0x40,
                         (long)*(int *)&current[1].nextbacktracks << 3);
        }
        else {
          if (psVar12->error == 0) {
            iVar2 = *(int *)&current[1].prev;
            psVar12->mode32 = 0;
            psVar8 = emit_x86_instruction(psVar12,1,0xc,0,0x8e,(long)iVar2);
            if (psVar8 != (sljit_u8 *)0x0) {
              *psVar8 = 0x8b;
            }
          }
          psVar9 = sljit_emit_jump(psVar12,0x19);
          if (psVar12->error == 0) {
            pjVar5 = (jump_list *)ensure_abuf(psVar12,0x10);
          }
          else {
            pjVar5 = (jump_list *)0x0;
          }
          if (pjVar5 != (jump_list *)0x0) {
            pjVar5->next = common->revertframes;
            pjVar5->jump = psVar9;
            common->revertframes = pjVar5;
          }
          in_R8 = (sljit_u32 *)0xc;
          sljit_emit_op2(psVar12,0x60,0xc,0,0xc,0,0x40,
                         (long)*(int *)((long)&current[1].prev + 4) * 8 + -8);
          if (current->topbacktracks != (jump_list *)0x0) {
            compile_backtrackingpath_cold_12();
          }
          if (psVar12->error == 0) {
            in_R8 = (sljit_u32 *)(long)(int)(~*(uint *)((long)&current[1].prev + 4) << 3);
            iVar2 = *(int *)&current[1].prev;
            psVar12->mode32 = 0;
            emit_mov(psVar12,0x8e,(long)iVar2,0x8c,(sljit_sw)in_R8);
          }
        }
        break;
      case 0x93:
        if (0x81 < *(ushort *)((long)&common_00->compiler + 2)) goto switchD_00152f8a_caseD_82;
      case 0x7e:
      case 0x7f:
      case 0x80:
      case 0x81:
        compile_assert_backtrackingpath(common,current);
        break;
      case 0x94:
        current->nextbacktracks = (jump_list *)0x0;
        current->top = (backtrack_common *)0x0;
        current->topbacktracks = (jump_list *)0x0;
        if (0x81 < *(ushort *)((long)&common_00->compiler + 2)) {
          compile_bracket_matchingpath(common,(PCRE2_SPTR16)common_00,current);
          pbVar6 = current->top;
          goto LAB_00153c75;
        }
        pjStack_a0 = (jump_list *)0x0;
        local_98._0_4_ = 0;
        local_98._4_4_ = 0;
        local_b8 = (backtrack_common *)0x0;
        pjStack_b0 = (jump_list *)0x0;
        jumplist = (jump_list *)0x0;
        pjStack_c0 = (jump_list *)0x0;
        pbStack_90 = current[1].prev;
        local_a8 = common_00;
        compile_assert_matchingpath(common,(PCRE2_SPTR16)common_00,(assert_backtrack *)&jumplist,0);
        break;
      case 0x96:
        if (local_f8->error == 0) {
          iVar2 = common->has_skip_arg;
          local_f8->mode32 = 0;
          psVar8 = emit_x86_instruction(local_f8,1,1,0,0x8c,(ulong)(iVar2 != 0) << 5);
          if (psVar8 != (sljit_u8 *)0x0) {
            *psVar8 = 0x8b;
          }
        }
        if ((common->has_skip_arg != 0) && (local_f8->error == 0)) {
          local_f8->mode32 = 0;
          psVar8 = emit_x86_instruction(local_f8,1,4,0,0x8c,0);
          if (psVar8 != (sljit_u8 *)0x0) {
            *psVar8 = 0x8b;
          }
        }
        psVar12 = local_f8;
        in_R8 = (sljit_u32 *)0xc;
        sljit_emit_op2(common->compiler,0x60,0xc,0,0xc,0,0x40,
                       (ulong)(common->has_skip_arg != 0) << 5 | 8);
        if (psVar12->error == 0) {
          iVar2 = common->mark_ptr;
          local_f8->mode32 = 0;
          in_R8 = (sljit_u32 *)0x8e;
          psVar8 = emit_x86_instruction(local_f8,1,1,0,0x8e,(long)iVar2);
          if (psVar8 != (sljit_u8 *)0x0) {
            *psVar8 = 0x89;
          }
        }
        if ((common->has_skip_arg != 0) && (local_f8->error == 0)) {
          iVar2 = common->control_head_ptr;
          local_f8->mode32 = 0;
          a = 4;
          psVar12 = local_f8;
          goto LAB_00153f46;
        }
        break;
      case 0x97:
      case 0x98:
      case 0x99:
      case 0x9a:
      case 0x9b:
      case 0x9c:
        psVar12 = common->compiler;
        if ((ushort)(uVar1 - 0x9b) < 2) {
          if (*local_e0 == (then_trap_backtrack *)0x0) {
            if ((common->local_quit_available != 0) || (common->in_positive_assertion == 0))
            goto LAB_001535a3;
            compile_backtrackingpath_cold_7();
          }
          else {
            compile_backtrackingpath_cold_6();
          }
        }
        else {
LAB_001535a3:
          if (common->local_quit_available == 0) {
            if (uVar1 == 0x99) {
              compile_backtrackingpath_cold_9();
            }
            else {
              if (uVar1 == 0x9a) {
                if (psVar12->error == 0) {
                  iVar2 = common->control_head_ptr;
                  psVar12->mode32 = 0;
                  uVar11 = 0;
                  in_R8 = (sljit_u32 *)0x8e;
                  psVar8 = emit_x86_instruction(psVar12,1,1,0,0x8e,(long)iVar2);
                  if (psVar8 != (sljit_u8 *)0x0) {
                    *psVar8 = 0x8b;
                  }
                }
                if (psVar12->error == 0) {
                  in_R8 = (sljit_u32 *)(current->cc + 2);
                  psVar12->mode32 = 0;
                  uVar11 = 0x40;
                  emit_mov(psVar12,2,0,0x40,(sljit_sw)in_R8);
                }
                sljit_emit_icall(psVar12,0x111,0x158efc,uVar11,(sljit_sw)in_R8);
                if (psVar12->error == 0) {
                  psVar12->mode32 = 0;
                  psVar8 = emit_x86_instruction(psVar12,1,1,0,2,0);
                  if (psVar8 != (sljit_u8 *)0x0) {
                    *psVar8 = 0x89;
                  }
                }
                in_R8 = (sljit_u32 *)0x40;
                psVar9 = sljit_emit_cmp(psVar12,1,1,0,0x40,0);
                pjVar5 = (jump_list *)0x0;
                if (psVar12->error == 0) {
                  pjVar5 = (jump_list *)ensure_abuf(psVar12,0x10);
                }
                if (pjVar5 != (jump_list *)0x0) {
                  pjVar5->next = common->reset_match;
                  pjVar5->jump = psVar9;
                  common->reset_match = pjVar5;
                }
                break;
              }
              compile_backtrackingpath_cold_10();
            }
            compile_backtrackingpath_cold_11();
          }
          else {
            compile_backtrackingpath_cold_8();
          }
        }
        break;
      case 0x9d:
      case 0x9e:
        if ((common->local_quit_available == 0) && (local_f8->error == 0)) {
          local_f8->mode32 = 0;
          in_R8 = (sljit_u32 *)0xffffffffffffffff;
          emit_mov(local_f8,1,0,0x40,-1);
        }
        psVar10 = common->quit_label;
        psVar9 = sljit_emit_jump(local_f8,0x18);
        if (psVar10 == (sljit_label *)0x0) {
          compile_backtrackingpath_cold_5();
        }
        else if ((psVar9 != (sljit_jump *)0x0) &&
                (psVar10 = common->quit_label, psVar10 != (sljit_label *)0x0)) {
          psVar9->flags = (psVar9->flags & 0xfffffffffffffffcU) + 1;
          (psVar9->u).target = (sljit_uw)psVar10;
        }
        break;
      case 0xa5:
        if ((then_trap_backtrack *)current[1].prev == (then_trap_backtrack *)0x0) {
          psVar12 = common->compiler;
          iVar2 = *(int *)&current[1].topbacktracks;
          if (*(int *)&current[1].topbacktracks < 1) {
            iVar2 = 0;
          }
          if (psVar12->error == 0) {
            psVar12->mode32 = 0;
            psVar8 = emit_x86_instruction(psVar12,1,1,0,0x8c,(ulong)(uint)(iVar2 * 8));
            if (psVar8 != (sljit_u8 *)0x0) {
              *psVar8 = 0x8b;
            }
          }
          sljit_emit_op2(common->compiler,0x60,0xc,0,0xc,0,0x40,(ulong)(iVar2 + 3) << 3);
          psVar9 = sljit_emit_jump(psVar12,0x18);
          pbVar6 = current[1].top;
          sljit_emit_label(psVar12);
          if (pbVar6 != (backtrack_common *)0x0) {
            compile_backtrackingpath_cold_2();
          }
          if (-1 < *(int *)&current[1].topbacktracks) {
            compile_backtrackingpath_cold_3();
          }
          if (psVar12->error == 0) {
            psVar12->mode32 = 0;
            psVar8 = emit_x86_instruction(psVar12,1,1,0,0x8c,0);
            if (psVar8 != (sljit_u8 *)0x0) {
              *psVar8 = 0x8b;
            }
          }
          in_R8 = (sljit_u32 *)0xc;
          sljit_emit_op2(common->compiler,0x60,0xc,0,0xc,0,0x40,0x18);
          psVar10 = sljit_emit_label(psVar12);
          if ((psVar9 != (sljit_jump *)0x0) && (psVar10 != (sljit_label *)0x0)) {
            psVar9->flags = (psVar9->flags & 0xfffffffffffffffcU) + 1;
            (psVar9->u).label = psVar10;
          }
          if (psVar12->error == 0) {
            iVar2 = common->control_head_ptr;
            psVar12->mode32 = 0;
            goto LAB_00153f3c;
          }
        }
        else {
          *local_e0 = (then_trap_backtrack *)current[1].prev;
        }
      }
      current = current->prev;
    } while (current != (backtrack_common *)0x0);
  }
  *local_e0 = local_50;
  return;
}

Assistant:

static void compile_backtrackingpath(compiler_common *common, struct backtrack_common *current)
{
DEFINE_COMPILER;
then_trap_backtrack *save_then_trap = common->then_trap;

while (current)
  {
  if (current->nextbacktracks != NULL)
    set_jumps(current->nextbacktracks, LABEL());
  switch(*current->cc)
    {
    case OP_SET_SOM:
    OP1(SLJIT_MOV, TMP1, 0, SLJIT_MEM1(STACK_TOP), STACK(0));
    free_stack(common, 1);
    OP1(SLJIT_MOV, SLJIT_MEM1(SLJIT_SP), OVECTOR(0), TMP1, 0);
    break;

    case OP_STAR:
    case OP_MINSTAR:
    case OP_PLUS:
    case OP_MINPLUS:
    case OP_QUERY:
    case OP_MINQUERY:
    case OP_UPTO:
    case OP_MINUPTO:
    case OP_EXACT:
    case OP_POSSTAR:
    case OP_POSPLUS:
    case OP_POSQUERY:
    case OP_POSUPTO:
    case OP_STARI:
    case OP_MINSTARI:
    case OP_PLUSI:
    case OP_MINPLUSI:
    case OP_QUERYI:
    case OP_MINQUERYI:
    case OP_UPTOI:
    case OP_MINUPTOI:
    case OP_EXACTI:
    case OP_POSSTARI:
    case OP_POSPLUSI:
    case OP_POSQUERYI:
    case OP_POSUPTOI:
    case OP_NOTSTAR:
    case OP_NOTMINSTAR:
    case OP_NOTPLUS:
    case OP_NOTMINPLUS:
    case OP_NOTQUERY:
    case OP_NOTMINQUERY:
    case OP_NOTUPTO:
    case OP_NOTMINUPTO:
    case OP_NOTEXACT:
    case OP_NOTPOSSTAR:
    case OP_NOTPOSPLUS:
    case OP_NOTPOSQUERY:
    case OP_NOTPOSUPTO:
    case OP_NOTSTARI:
    case OP_NOTMINSTARI:
    case OP_NOTPLUSI:
    case OP_NOTMINPLUSI:
    case OP_NOTQUERYI:
    case OP_NOTMINQUERYI:
    case OP_NOTUPTOI:
    case OP_NOTMINUPTOI:
    case OP_NOTEXACTI:
    case OP_NOTPOSSTARI:
    case OP_NOTPOSPLUSI:
    case OP_NOTPOSQUERYI:
    case OP_NOTPOSUPTOI:
    case OP_TYPESTAR:
    case OP_TYPEMINSTAR:
    case OP_TYPEPLUS:
    case OP_TYPEMINPLUS:
    case OP_TYPEQUERY:
    case OP_TYPEMINQUERY:
    case OP_TYPEUPTO:
    case OP_TYPEMINUPTO:
    case OP_TYPEEXACT:
    case OP_TYPEPOSSTAR:
    case OP_TYPEPOSPLUS:
    case OP_TYPEPOSQUERY:
    case OP_TYPEPOSUPTO:
    case OP_CLASS:
    case OP_NCLASS:
#if defined SUPPORT_UNICODE || PCRE2_CODE_UNIT_WIDTH != 8
    case OP_XCLASS:
#endif
    compile_iterator_backtrackingpath(common, current);
    break;

    case OP_REF:
    case OP_REFI:
    case OP_DNREF:
    case OP_DNREFI:
    compile_ref_iterator_backtrackingpath(common, current);
    break;

    case OP_RECURSE:
    compile_recurse_backtrackingpath(common, current);
    break;

    case OP_ASSERT:
    case OP_ASSERT_NOT:
    case OP_ASSERTBACK:
    case OP_ASSERTBACK_NOT:
    compile_assert_backtrackingpath(common, current);
    break;

    case OP_ONCE:
    case OP_BRA:
    case OP_CBRA:
    case OP_COND:
    case OP_SBRA:
    case OP_SCBRA:
    case OP_SCOND:
    compile_bracket_backtrackingpath(common, current);
    break;

    case OP_BRAZERO:
    if (current->cc[1] > OP_ASSERTBACK_NOT)
      compile_bracket_backtrackingpath(common, current);
    else
      compile_assert_backtrackingpath(common, current);
    break;

    case OP_BRAPOS:
    case OP_CBRAPOS:
    case OP_SBRAPOS:
    case OP_SCBRAPOS:
    case OP_BRAPOSZERO:
    compile_bracketpos_backtrackingpath(common, current);
    break;

    case OP_BRAMINZERO:
    compile_braminzero_backtrackingpath(common, current);
    break;

    case OP_MARK:
    OP1(SLJIT_MOV, TMP1, 0, SLJIT_MEM1(STACK_TOP), STACK(common->has_skip_arg ? 4 : 0));
    if (common->has_skip_arg)
      OP1(SLJIT_MOV, TMP2, 0, SLJIT_MEM1(STACK_TOP), STACK(0));
    free_stack(common, common->has_skip_arg ? 5 : 1);
    OP1(SLJIT_MOV, SLJIT_MEM1(SLJIT_SP), common->mark_ptr, TMP1, 0);
    if (common->has_skip_arg)
      OP1(SLJIT_MOV, SLJIT_MEM1(SLJIT_SP), common->control_head_ptr, TMP2, 0);
    break;

    case OP_THEN:
    case OP_THEN_ARG:
    case OP_PRUNE:
    case OP_PRUNE_ARG:
    case OP_SKIP:
    case OP_SKIP_ARG:
    compile_control_verb_backtrackingpath(common, current);
    break;

    case OP_COMMIT:
    case OP_COMMIT_ARG:
    if (!common->local_quit_available)
      OP1(SLJIT_MOV, SLJIT_RETURN_REG, 0, SLJIT_IMM, PCRE2_ERROR_NOMATCH);
    if (common->quit_label == NULL)
      add_jump(compiler, &common->quit, JUMP(SLJIT_JUMP));
    else
      JUMPTO(SLJIT_JUMP, common->quit_label);
    break;

    case OP_CALLOUT:
    case OP_CALLOUT_STR:
    case OP_FAIL:
    case OP_ACCEPT:
    case OP_ASSERT_ACCEPT:
    set_jumps(current->topbacktracks, LABEL());
    break;

    case OP_THEN_TRAP:
    /* A virtual opcode for then traps. */
    compile_then_trap_backtrackingpath(common, current);
    break;

    default:
    SLJIT_UNREACHABLE();
    break;
    }
  current = current->prev;
  }
common->then_trap = save_then_trap;
}